

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPlistParser.cxx
# Opt level: O3

optional<Json::Value> * cmParsePlist(optional<Json::Value> *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  bool bVar2;
  int fd;
  Status *pSVar3;
  uv_loop_t *loop;
  long *plVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  cmUVProcessChain chain;
  Value value;
  cmUVProcessChainBuilder builder;
  cmUVPipeIStream outputStream;
  Reader reader;
  undefined1 local_370 [8];
  Value local_368;
  cmUVProcessChainBuilder local_340;
  undefined1 local_2e0 [32];
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_260;
  uv_handle_ptr_base_<uv_pipe_s> local_258;
  undefined8 local_248;
  long *local_240 [2];
  long local_230 [30];
  Reader local_140;
  
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_340);
  local_2e0._0_8_ = local_2e0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"/usr/bin/plutil","");
  local_2c0[0] = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"-convert","");
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"json","");
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"-o","");
  local_260 = &local_258.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"-","");
  plVar4 = local_230;
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_240[0] = plVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,pcVar1,pcVar1 + filename->_M_string_length);
  __l._M_len = 6;
  __l._M_array = (iterator)local_2e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_140,__l,(allocator_type *)(local_370 + 8));
  cmUVProcessChainBuilder::AddCommand
            (&local_340,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_140);
  lVar5 = -0xc0;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  cmUVProcessChainBuilder::SetBuiltinStream(&local_340,Stream_OUTPUT);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_370);
  cmUVProcessChain::Wait((cmUVProcessChain *)local_370,0);
  pSVar3 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_370,0);
  if (pSVar3->ExitStatus == 0) {
    Json::Reader::Reader(&local_140);
    Json::Value::Value((Value *)(local_370 + 8),nullValue);
    loop = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_370);
    fd = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_370);
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream
              ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)local_2e0,loop,fd);
    bVar2 = Json::Reader::parse(&local_140,(istream *)local_2e0,(Value *)(local_370 + 8),true);
    if (bVar2) {
      Json::Value::Value((Value *)__return_storage_ptr__,(Value *)(local_370 + 8));
    }
    (__return_storage_ptr__->super__Optional_base<Json::Value,_false,_false>)._M_payload.
    super__Optional_payload<Json::Value,_true,_false,_false>.
    super__Optional_payload_base<Json::Value>._M_engaged = bVar2;
    local_2e0._0_8_ = cmBasicUVPipeIStream<char,std::char_traits<char>>::vtable + 0x18;
    local_248 = 0xa13698;
    cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_258);
    local_2e0._0_8_ =
         cmBasicUVIStream<char,std::char_traits<char>>-in-cmBasicUVPipeIStream<char,std::char_traits<char>>
         ::construction_vtable + 0x18;
    local_248 = 0xa13718;
    cmBasicUVStreambuf<char,_std::char_traits<char>_>::~cmBasicUVStreambuf
              ((cmBasicUVStreambuf<char,_std::char_traits<char>_> *)(local_2e0 + 0x10));
    local_2e0._0_8_ =
         std::istream-in-cmBasicUVPipeIStream<char,std::char_traits<char>>::construction_vtable +
         0x18;
    local_248 = 0xa13780;
    local_2e0._8_8_ = 0;
    std::ios_base::~ios_base((ios_base *)&local_248);
    Json::Value::~Value((Value *)(local_370 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
      operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                      local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
      operator_delete(local_140.document_._M_dataplus._M_p,
                      local_140.document_.field_2._M_allocated_capacity + 1);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
              (&local_140.errors_);
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  }
  else {
    (__return_storage_ptr__->super__Optional_base<Json::Value,_false,_false>)._M_payload.
    super__Optional_payload<Json::Value,_true,_false,_false>.
    super__Optional_payload_base<Json::Value>._M_engaged = false;
  }
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.WorkingDirectory._M_dataplus._M_p != &local_340.WorkingDirectory.field_2) {
    operator_delete(local_340.WorkingDirectory._M_dataplus._M_p,
                    local_340.WorkingDirectory.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_340.Processes);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<Json::Value> cmParsePlist(const std::string& filename)
{
  cmUVProcessChainBuilder builder;
  builder.AddCommand(
    { "/usr/bin/plutil", "-convert", "json", "-o", "-", filename });
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT);

  auto chain = builder.Start();
  chain.Wait();

  auto const& status = chain.GetStatus(0);
  if (status.ExitStatus != 0) {
    return cm::nullopt;
  }

  Json::Reader reader;
  Json::Value value;
  cmUVPipeIStream outputStream(chain.GetLoop(), chain.OutputStream());
  if (!reader.parse(outputStream, value)) {
    return cm::nullopt;
  }
  return cm::optional<Json::Value>(value);
}